

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_enc_dec.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  string *psVar4;
  string inputEsiStr;
  string outputEsiStr;
  string inputFname;
  string outputFname;
  uint local_138;
  uint local_134;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"input.bin","");
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"output.bin","");
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"");
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"");
  local_134 = 0x200;
  local_138 = 5;
LAB_0010381a:
  while( true ) {
    iVar2 = getopt(argc,argv,"hi:T:K:o:I:O:");
    pcVar3 = _optarg;
    if (iVar2 < 0x54) break;
    if (iVar2 < 0x6f) {
      if (iVar2 == 0x69) {
        psVar4 = &local_f0;
        goto LAB_00103865;
      }
      if (iVar2 == 0x54) {
        local_134 = atoi(_optarg);
      }
      else if (iVar2 == 0x68) {
        puts(
            "RQ File Encoder Decoder.\n\n   -h          display this help screen and exit\n   -i <str>    indicates the input filename to use for the operation\n   -o <str>    indicates the output filename to write output for the operation\n   -K <value>  the k value to use for encode/decode\n   -T <value>  the symbol size to use for encode/decode\n   -I <str>    input ESI string\n   -O <str>    output ESI string\n"
            );
        exit(0);
      }
    }
    else {
      psVar4 = &local_d0;
      if (iVar2 == 0x6f) goto LAB_00103865;
    }
  }
  if (iVar2 < 0x4b) {
    if (iVar2 != 0x49) {
      if (iVar2 == -1) {
        puts("Settings used: ");
        printf("K: %d\n",(ulong)local_138);
        printf("Symbol size: %d\n",(ulong)local_134);
        printf("Input Filename: %s\n",local_f0._M_dataplus._M_p);
        printf("Output Filename: %s\n",local_d0._M_dataplus._M_p);
        expandEsiStr(&local_130);
        std::__cxx11::string::_M_assign((string *)&local_130);
        printf("Input ESI string: %s\n",local_130._M_dataplus._M_p);
        expandEsiStr(&local_110);
        std::__cxx11::string::_M_assign((string *)&local_110);
        printf("Output ESI string: %s\n",local_110._M_dataplus._M_p);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,local_f0._M_dataplus._M_p,
                   local_f0._M_dataplus._M_p + local_f0._M_string_length);
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,local_d0._M_dataplus._M_p,
                   local_d0._M_dataplus._M_p + local_d0._M_string_length);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,local_130._M_dataplus._M_p,
                   local_130._M_dataplus._M_p + local_130._M_string_length);
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,local_110._M_dataplus._M_p,
                   local_110._M_dataplus._M_p + local_110._M_string_length);
        iVar2 = transcode(local_138,local_134,&local_50,&local_70,&local_90,&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        pcVar3 = "--> Succeeded\n";
        if (iVar2 == 0) {
          pcVar3 = "--> Failed\n";
        }
        puts(pcVar3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        return (int)(iVar2 == 0);
      }
      if (iVar2 == 0x3f) {
        exit(1);
      }
      goto LAB_0010381a;
    }
    psVar4 = &local_130;
  }
  else {
    if (iVar2 != 0x4f) {
      if (iVar2 == 0x4b) {
        local_138 = atoi(_optarg);
      }
      goto LAB_0010381a;
    }
    psVar4 = &local_110;
  }
LAB_00103865:
  pcVar1 = (char *)psVar4->_M_string_length;
  strlen(_optarg);
  std::__cxx11::string::_M_replace((ulong)psVar4,0,pcVar1,(ulong)pcVar3);
  goto LAB_0010381a;
}

Assistant:

int main(int argc, char** argv)
{
    int Kval = 5;
    int symSize = 512;

    string inputFname = "input.bin";
    string outputFname = "output.bin";
    string inputEsiStr = "";
    string outputEsiStr = "";


    /* scan command lines */
    int c;
    while ((c = getopt(argc, argv, "hi:T:K:o:I:O:")) != -1) {
        switch (c) {
        case 'h':
            usage();
            break;
        case 'i':
            inputFname = optarg;
            break;
        case 'o':
            outputFname = optarg;
            break;
        case 'I':
            inputEsiStr = optarg;
            break;
        case 'O':
            outputEsiStr = optarg;
            break;
        case 'T':
            symSize = atoi(optarg);
            break;
        case 'K':
            Kval = atoi(optarg);
            break;
        case '?':
            exit(EXIT_FAILURE);
        };
    }

    /* Dump the input arguments */
    printf ("Settings used: \n");
    printf ("K: %d\n", Kval);
    printf ("Symbol size: %d\n", symSize);
    printf ("Input Filename: %s\n", inputFname.c_str());
    printf ("Output Filename: %s\n", outputFname.c_str());
    inputEsiStr = expandEsiStr(inputEsiStr);
    printf ("Input ESI string: %s\n", inputEsiStr.c_str());
    outputEsiStr = expandEsiStr(outputEsiStr);
    printf ("Output ESI string: %s\n", outputEsiStr.c_str());

    /* Encode/Decode */
    int status = 0;

    if (transcode(Kval, symSize, inputFname, outputFname, inputEsiStr, outputEsiStr)) {
        printf("--> Succeeded\n\n");
    } else {
        printf("--> Failed\n\n");
        status = 1;
    }

    return status;
}